

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O2

void packforblock26_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  ulong *puVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  uint64_t uVar32;
  int iVar33;
  
  puVar1 = *pin;
  uVar2 = puVar1[2];
  uVar3 = puVar1[3];
  uVar4 = puVar1[4];
  uVar5 = puVar1[5];
  uVar6 = puVar1[6];
  uVar7 = puVar1[7];
  uVar8 = puVar1[8];
  uVar9 = puVar1[9];
  uVar10 = puVar1[10];
  uVar11 = puVar1[0xb];
  uVar12 = puVar1[0xc];
  uVar13 = puVar1[0xd];
  uVar14 = puVar1[0xe];
  uVar15 = puVar1[0xf];
  uVar29 = puVar1[0x10];
  iVar33 = (int)base;
  uVar16 = puVar1[0x11];
  uVar17 = puVar1[0x12];
  uVar18 = puVar1[0x13];
  uVar19 = puVar1[0x14];
  uVar30 = puVar1[0x15];
  uVar20 = puVar1[0x16];
  uVar21 = puVar1[0x17];
  uVar22 = puVar1[0x18];
  uVar23 = puVar1[0x19];
  uVar31 = puVar1[0x1a];
  uVar24 = puVar1[0x1b];
  uVar25 = puVar1[0x1c];
  uVar26 = puVar1[0x1d];
  uVar27 = puVar1[0x1e];
  uVar32 = puVar1[0x1f];
  puVar28 = (ulong *)*pw;
  *puVar28 = uVar2 - base << 0x34 | (puVar1[1] - base) * 0x4000000 | *puVar1 - base;
  puVar28[1] = uVar4 - base << 0x28 | (uVar3 - base) * 0x4000 | uVar2 - base >> 0xc;
  puVar28[2] = uVar7 - base << 0x36 | (uVar6 - base) * 0x10000000 |
               (uVar5 - base) * 4 | uVar4 - base >> 0x18;
  puVar28[3] = uVar9 - base << 0x2a | (uVar8 - base) * 0x10000 | uVar7 - base >> 10;
  puVar28[4] = uVar12 - base << 0x38 | (uVar11 - base) * 0x40000000 |
               (uVar10 - base) * 0x10 | uVar9 - base >> 0x16;
  puVar28[5] = uVar14 - base << 0x2c | (uVar13 - base) * 0x40000 | uVar12 - base >> 8;
  puVar28[6] = uVar16 - base << 0x3a | (ulong)(uint)((int)uVar29 - iVar33) << 0x20 |
               (uVar15 - base) * 0x40 | uVar14 - base >> 0x14;
  puVar28[7] = uVar18 - base << 0x2e | (uVar17 - base) * 0x100000 | uVar16 - base >> 6;
  puVar28[8] = uVar20 - base << 0x3c | (ulong)(uint)((int)uVar30 - iVar33) << 0x22 |
               (uVar19 - base) * 0x100 | uVar18 - base >> 0x12;
  puVar28[9] = uVar22 - base << 0x30 | (uVar21 - base) * 0x400000 | uVar20 - base >> 4;
  puVar28[10] = uVar24 - base << 0x3e | (ulong)(uint)((int)uVar31 - iVar33) << 0x24 |
                (uVar23 - base) * 0x400 | uVar22 - base >> 0x10;
  puVar28[0xb] = uVar26 - base << 0x32 | (uVar25 - base) * 0x1000000 | uVar24 - base >> 2;
  puVar28[0xc] = (ulong)(uint)((int)uVar32 - iVar33) << 0x26 |
                 (uVar27 - base) * 0x1000 | uVar26 - base >> 0xe;
  *pin = puVar1 + 0x20;
  *pw = *pw + 0x68;
  return;
}

Assistant:

static void packforblock26_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  13 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  uint64_t w10;
  uint64_t w11;
  uint64_t w12;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 26;
  w0 |= (in[2] - base) << 52;
  w1 = (in[2] - base) >> 12;
  w1 |=  (in[3] - base) << 14;
  w1 |= (in[4] - base) << 40;
  w2 = (in[4] - base) >> 24;
  w2 |=  (in[5] - base) << 2;
  w2 |=  (in[6] - base) << 28;
  w2 |= (in[7] - base) << 54;
  w3 = (in[7] - base) >> 10;
  w3 |=  (in[8] - base) << 16;
  w3 |= (in[9] - base) << 42;
  w4 = (in[9] - base) >> 22;
  w4 |=  (in[10] - base) << 4;
  w4 |=  (in[11] - base) << 30;
  w4 |= (in[12] - base) << 56;
  w5 = (in[12] - base) >> 8;
  w5 |=  (in[13] - base) << 18;
  w5 |= (in[14] - base) << 44;
  w6 = (in[14] - base) >> 20;
  w6 |=  (in[15] - base) << 6;
  w6 |=  (in[16] - base) << 32;
  w6 |= (in[17] - base) << 58;
  w7 = (in[17] - base) >> 6;
  w7 |=  (in[18] - base) << 20;
  w7 |= (in[19] - base) << 46;
  w8 = (in[19] - base) >> 18;
  w8 |=  (in[20] - base) << 8;
  w8 |=  (in[21] - base) << 34;
  w8 |= (in[22] - base) << 60;
  w9 = (in[22] - base) >> 4;
  w9 |=  (in[23] - base) << 22;
  w9 |= (in[24] - base) << 48;
  w10 = (in[24] - base) >> 16;
  w10 |=  (in[25] - base) << 10;
  w10 |=  (in[26] - base) << 36;
  w10 |= (in[27] - base) << 62;
  w11 = (in[27] - base) >> 2;
  w11 |=  (in[28] - base) << 24;
  w11 |= (in[29] - base) << 50;
  w12 = (in[29] - base) >> 14;
  w12 |=  (in[30] - base) << 12;
  w12 |=  (in[31] - base) << 38;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  pw64[10] = w10;
  pw64[11] = w11;
  pw64[12] = w12;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 104; /* we used up 104 output bytes */ 
}